

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

uchar * jpgd::decompress_jpeg_image_from_file
                  (char *pSrc_filename,int *width,int *height,int *actual_comps,int req_comps,
                  uint32_t flags)

{
  int iVar1;
  uchar *puVar2;
  jpeg_decoder_file_stream file_stream;
  jpeg_decoder_file_stream local_40;
  
  local_40.super_jpeg_decoder_stream._vptr_jpeg_decoder_stream =
       (_func_int **)&PTR__jpeg_decoder_file_stream_00244a50;
  local_40.m_pFile = (FILE *)0x0;
  local_40.m_eof_flag = false;
  local_40.m_error_flag = false;
  iVar1 = jpeg_decoder_file_stream::open(&local_40,pSrc_filename,(int)height);
  if ((char)iVar1 == '\0') {
    puVar2 = (uchar *)0x0;
  }
  else {
    puVar2 = decompress_jpeg_image_from_stream
                       (&local_40.super_jpeg_decoder_stream,width,height,actual_comps,req_comps,
                        flags);
  }
  jpeg_decoder_file_stream::~jpeg_decoder_file_stream(&local_40);
  return puVar2;
}

Assistant:

unsigned char* decompress_jpeg_image_from_file(const char* pSrc_filename, int* width, int* height, int* actual_comps, int req_comps, uint32_t flags)
	{
		jpgd::jpeg_decoder_file_stream file_stream;
		if (!file_stream.open(pSrc_filename))
			return nullptr;
		return decompress_jpeg_image_from_stream(&file_stream, width, height, actual_comps, req_comps, flags);
	}